

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

string * __thiscall
pbrt::PiecewiseConstant2D::ToString_abi_cxx11_
          (string *__return_storage_ptr__,PiecewiseConstant2D *this)

{
  PiecewiseConstant1D *in_R9;
  
  StringPrintf<pbrt::Bounds2<float>const&,pstd::vector<pbrt::PiecewiseConstant1D,pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>>const&,pbrt::PiecewiseConstant1D_const&>
            (__return_storage_ptr__,
             (pbrt *)"[ PiecewiseConstant2D domain: %s pConditionalV: %s pMarginal: %s ]",
             (char *)this,(Bounds2<float> *)&this->pConditionalV,
             (vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
              *)&this->pMarginal,in_R9);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
        return StringPrintf("[ PiecewiseConstant2D domain: %s pConditionalV: %s "
                            "pMarginal: %s ]",
                            domain, pConditionalV, pMarginal);
    }